

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_seek_to_pcm_frame(ma_dr_wav *pWav,ma_uint64 targetFrameIndex)

{
  ma_bool32 mVar1;
  ma_uint32 mVar2;
  ulong uVar3;
  ulong in_RSI;
  ma_dr_wav *in_RDI;
  int offset32;
  ma_uint32 bytesPerFrame;
  ma_uint64 offset;
  ma_uint64 targetBytePos;
  ma_uint64 currentBytePos;
  ma_uint64 totalSizeInBytes;
  ma_uint64 framesToRead;
  ma_uint64 framesRead;
  ma_int16 devnull [2048];
  ma_uint64 offsetInFrames;
  undefined4 in_stack_ffffffffffffef88;
  undefined4 in_stack_ffffffffffffef8c;
  uint uVar4;
  ulong local_1058;
  ma_uint64 local_1038;
  ma_uint64 local_1030;
  ma_int16 *in_stack_ffffffffffffeff8;
  ma_uint64 in_stack_fffffffffffff000;
  ma_dr_wav *in_stack_fffffffffffff008;
  ma_int16 *in_stack_fffffffffffff018;
  ma_uint64 in_stack_fffffffffffff020;
  ma_dr_wav *in_stack_fffffffffffff028;
  ulong local_20;
  ulong local_18;
  ma_bool32 local_8;
  
  if ((in_RDI == (ma_dr_wav *)0x0) || (in_RDI->onSeek == (ma_dr_wav_seek_proc)0x0)) {
    local_8 = 0;
  }
  else if (in_RDI->onWrite == (ma_dr_wav_write_proc)0x0) {
    if (in_RDI->totalPCMFrameCount == 0) {
      local_8 = 1;
    }
    else {
      local_18 = in_RSI;
      if (in_RDI->totalPCMFrameCount < in_RSI) {
        local_18 = in_RDI->totalPCMFrameCount;
      }
      if (in_RDI->translatedFormatTag == 2 || in_RDI->translatedFormatTag == 0x11) {
        if ((local_18 < in_RDI->readCursorInPCMFrames) &&
           (mVar1 = ma_dr_wav_seek_to_first_pcm_frame
                              ((ma_dr_wav *)
                               CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88)),
           mVar1 == 0)) {
          return 0;
        }
        if (in_RDI->readCursorInPCMFrames < local_18) {
          for (local_20 = local_18 - in_RDI->readCursorInPCMFrames; local_20 != 0;
              local_20 = local_20 - local_1030) {
            local_1030 = 0;
            local_1038 = local_20;
            if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x800)) / ZEXT216(in_RDI->channels),0) <
                local_20) {
              local_1038 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x800)) / ZEXT216(in_RDI->channels),
                                  0);
            }
            if (in_RDI->translatedFormatTag == 2) {
              local_1030 = ma_dr_wav_read_pcm_frames_s16__msadpcm
                                     (in_stack_fffffffffffff008,in_stack_fffffffffffff000,
                                      in_stack_ffffffffffffeff8);
            }
            else if (in_RDI->translatedFormatTag == 0x11) {
              local_1030 = ma_dr_wav_read_pcm_frames_s16__ima
                                     (in_stack_fffffffffffff028,in_stack_fffffffffffff020,
                                      in_stack_fffffffffffff018);
            }
            if (local_1030 != local_1038) {
              return 0;
            }
          }
        }
      }
      else {
        mVar2 = ma_dr_wav_get_bytes_per_pcm_frame(in_RDI);
        if (mVar2 == 0) {
          return 0;
        }
        uVar3 = in_RDI->totalPCMFrameCount * (ulong)mVar2 - in_RDI->bytesRemaining;
        local_1058 = local_18 * mVar2;
        if (uVar3 < local_1058) {
          local_1058 = local_1058 - uVar3;
        }
        else {
          mVar1 = ma_dr_wav_seek_to_first_pcm_frame
                            ((ma_dr_wav *)
                             CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
          if (mVar1 == 0) {
            return 0;
          }
        }
        for (; local_1058 != 0; local_1058 = local_1058 - (long)(int)uVar4) {
          if (local_1058 < 0x80000000) {
            uVar4 = (uint)local_1058;
          }
          else {
            uVar4 = 0x7fffffff;
          }
          mVar1 = (*in_RDI->onSeek)(in_RDI->pUserData,uVar4,ma_dr_wav_seek_origin_current);
          if (mVar1 == 0) {
            return 0;
          }
          in_RDI->readCursorInPCMFrames =
               (ulong)uVar4 / (ulong)mVar2 + in_RDI->readCursorInPCMFrames;
          in_RDI->bytesRemaining = in_RDI->bytesRemaining - (long)(int)uVar4;
        }
      }
      local_8 = 1;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

MA_API ma_bool32 ma_dr_wav_seek_to_pcm_frame(ma_dr_wav* pWav, ma_uint64 targetFrameIndex)
{
    if (pWav == NULL || pWav->onSeek == NULL) {
        return MA_FALSE;
    }
    if (pWav->onWrite != NULL) {
        return MA_FALSE;
    }
    if (pWav->totalPCMFrameCount == 0) {
        return MA_TRUE;
    }
    if (targetFrameIndex > pWav->totalPCMFrameCount) {
        targetFrameIndex = pWav->totalPCMFrameCount;
    }
    if (ma_dr_wav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        if (targetFrameIndex < pWav->readCursorInPCMFrames) {
            if (!ma_dr_wav_seek_to_first_pcm_frame(pWav)) {
                return MA_FALSE;
            }
        }
        if (targetFrameIndex > pWav->readCursorInPCMFrames) {
            ma_uint64 offsetInFrames = targetFrameIndex - pWav->readCursorInPCMFrames;
            ma_int16 devnull[2048];
            while (offsetInFrames > 0) {
                ma_uint64 framesRead = 0;
                ma_uint64 framesToRead = offsetInFrames;
                if (framesToRead > ma_dr_wav_countof(devnull)/pWav->channels) {
                    framesToRead = ma_dr_wav_countof(devnull)/pWav->channels;
                }
                if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM) {
                    framesRead = ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, devnull);
                } else if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
                    framesRead = ma_dr_wav_read_pcm_frames_s16__ima(pWav, framesToRead, devnull);
                } else {
                    MA_DR_WAV_ASSERT(MA_FALSE);
                }
                if (framesRead != framesToRead) {
                    return MA_FALSE;
                }
                offsetInFrames -= framesRead;
            }
        }
    } else {
        ma_uint64 totalSizeInBytes;
        ma_uint64 currentBytePos;
        ma_uint64 targetBytePos;
        ma_uint64 offset;
        ma_uint32 bytesPerFrame;
        bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
        if (bytesPerFrame == 0) {
            return MA_FALSE;
        }
        totalSizeInBytes = pWav->totalPCMFrameCount * bytesPerFrame;
        currentBytePos = totalSizeInBytes - pWav->bytesRemaining;
        targetBytePos  = targetFrameIndex * bytesPerFrame;
        if (currentBytePos < targetBytePos) {
            offset = (targetBytePos - currentBytePos);
        } else {
            if (!ma_dr_wav_seek_to_first_pcm_frame(pWav)) {
                return MA_FALSE;
            }
            offset = targetBytePos;
        }
        while (offset > 0) {
            int offset32 = ((offset > INT_MAX) ? INT_MAX : (int)offset);
            if (!pWav->onSeek(pWav->pUserData, offset32, ma_dr_wav_seek_origin_current)) {
                return MA_FALSE;
            }
            pWav->readCursorInPCMFrames += offset32 / bytesPerFrame;
            pWav->bytesRemaining        -= offset32;
            offset                      -= offset32;
        }
    }
    return MA_TRUE;
}